

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_if.cpp
# Opt level: O1

IfCase __thiscall pfederc::Parser::parseIfStart(Parser *this,bool isensure)

{
  Token *pTVar1;
  pointer pcVar2;
  size_t sVar3;
  istream *piVar4;
  bool bVar5;
  int in_EDX;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> extraout_RDX;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> extraout_RDX_00;
  _Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false> _Var6;
  undefined7 in_register_00000031;
  Parser *this_00;
  Parser *this_01;
  IfCase IVar7;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> cond;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> bodyExpr;
  Lexer *local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,isensure);
  if (in_EDX == 0) {
LAB_001145e4:
    bVar5 = expect(this_00,TOK_KW_IF);
    if (bVar5) goto LAB_001146bd;
    pTVar1 = this_00->lexer->currentToken;
    local_50 = (Lexer *)operator_new(0x38);
    sVar3 = (pTVar1->pos).line;
    piVar4 = (istream *)(pTVar1->pos).startIndex;
    pcVar2 = (pointer)(pTVar1->pos).endIndex;
    *(Level *)&local_50->_vptr_Lexer = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&local_50->_vptr_Lexer + 4) = STX_ERR_EXPECTED_EOL_IF;
    ((Position *)&local_50->cfg)->line = sVar3;
    local_50->input = piVar4;
    (local_50->filePath)._M_dataplus._M_p = pcVar2;
    (local_50->filePath)._M_string_length = 0;
    (local_50->filePath).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(local_50->filePath).field_2 + 8) = 0;
    this_01 = (Parser *)local_38;
  }
  else {
    bVar5 = expect(this_00,TOK_KW_ENSURE);
    if (bVar5) {
      if ((char)in_EDX != '\0') goto LAB_001146bd;
      goto LAB_001145e4;
    }
    pTVar1 = this_00->lexer->currentToken;
    local_50 = (Lexer *)operator_new(0x38);
    sVar3 = (pTVar1->pos).line;
    piVar4 = (istream *)(pTVar1->pos).startIndex;
    pcVar2 = (pointer)(pTVar1->pos).endIndex;
    *(Level *)&local_50->_vptr_Lexer = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&local_50->_vptr_Lexer + 4) = STX_ERR_EXPECTED_EOL_ENSURE;
    ((Position *)&local_50->cfg)->line = sVar3;
    local_50->input = piVar4;
    (local_50->filePath)._M_dataplus._M_p = pcVar2;
    (local_50->filePath)._M_string_length = 0;
    (local_50->filePath).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(local_50->filePath).field_2 + 8) = 0;
    this_01 = (Parser *)(local_38 + 8);
  }
  generateError(this_01,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this_00);
  std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)this_01);
  if (local_50 != (Lexer *)0x0) {
    std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
              ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_50,
               (Error<pfederc::SyntaxErrorCode> *)local_50);
  }
LAB_001146bd:
  parseExpression((Parser *)&local_50,isensure);
  bVar5 = expect(this_00,TOK_EOL);
  if (!bVar5) {
    pTVar1 = this_00->lexer->currentToken;
    local_48._0_8_ = operator_new(0x38);
    sVar3 = (pTVar1->pos).line;
    piVar4 = (istream *)(pTVar1->pos).startIndex;
    pcVar2 = (pointer)(pTVar1->pos).endIndex;
    *(undefined2 *)&((Lexer *)local_48._0_8_)->_vptr_Lexer = 2;
    *(undefined4 *)((long)&((Lexer *)local_48._0_8_)->_vptr_Lexer + 4) = 0xf;
    *(size_t *)&(((Lexer *)local_48._0_8_)->cfg).multiLineString = sVar3;
    ((Lexer *)local_48._0_8_)->input = piVar4;
    (((Lexer *)local_48._0_8_)->filePath)._M_dataplus._M_p = pcVar2;
    (((Lexer *)local_48._0_8_)->filePath)._M_string_length = 0;
    (((Lexer *)local_48._0_8_)->filePath).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((Lexer *)local_48._0_8_)->filePath).field_2 + 8) = 0;
    generateError((Parser *)(local_48 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_00);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_48 + 8));
    if ((Lexer *)local_48._0_8_ != (Lexer *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_48,
                 (Error<pfederc::SyntaxErrorCode> *)local_48._0_8_);
    }
    skipToEol(this_00);
  }
  parseFunctionBody((Parser *)local_48);
  this->lexer = (Lexer *)local_48._0_8_;
  local_48._0_8_ = (Lexer *)0x0;
  (this->errors).
  super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_50;
  local_50 = (Lexer *)0x0;
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_48);
  _Var6._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       extraout_RDX._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (local_50 != (Lexer *)0x0) {
    (*local_50->_vptr_Lexer[1])();
    _Var6._M_head_impl._M_t.
    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
         extraout_RDX_00._M_t.
         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  }
  IVar7.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
  ._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       _Var6._M_head_impl._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  IVar7.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .
  super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .
  super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
       (_Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
        )(_Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
          )this;
  return (IfCase)IVar7.
                 super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  ;
}

Assistant:

IfCase Parser::parseIfStart(bool isensure) noexcept {
  // parse 'ensure' or 'if'
  if (isensure && !expect(TokenType::TOK_KW_ENSURE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL_ENSURE,
          lexer.getCurrentToken()->getPosition()));
  } else if (!isensure && !expect(TokenType::TOK_KW_IF)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL_IF,
          lexer.getCurrentToken()->getPosition()));
  }
  // parse condition
  std::unique_ptr<Expr> cond(parseExpression());
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
    skipToEol();
  }
  // parse body
  std::unique_ptr<BodyExpr> bodyExpr(parseFunctionBody());
  // result
  return IfCase(std::move(cond), std::move(bodyExpr));
}